

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O1

void __thiscall
AsyncLogging::AsyncLogging(AsyncLogging *this,string *logFileName_,int flushInterval)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  MutexLock *__mutex;
  pointer pcVar2;
  FixedBuffer<4000000> *pFVar3;
  string local_a8;
  string *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  Thread *local_78;
  MutexLock *local_70;
  pthread_cond_t *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this->flushInterval_ = flushInterval;
  this->running_ = false;
  paVar1 = &(this->basename_).field_2;
  (this->basename_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (logFileName_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->basename_,pcVar2,pcVar2 + logFileName_->_M_string_length);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_88 = &this->basename_;
  local_80 = paVar1;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = threadFunc;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(AsyncLogging **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(AsyncLogging::*(AsyncLogging_*))()>_>::
               _M_invoke;
  local_48 = std::_Function_handler<void_(),_std::_Bind<void_(AsyncLogging::*(AsyncLogging_*))()>_>
             ::_M_manager;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Logging","");
  local_78 = &this->thread_;
  Thread::Thread(local_78,(ThreadFunc *)&local_58,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  __mutex = &this->mutex_;
  pthread_mutex_init((pthread_mutex_t *)__mutex,(pthread_mutexattr_t *)0x0);
  (this->cond_).mutex = __mutex;
  local_68 = &(this->cond_).cond;
  local_70 = __mutex;
  pthread_cond_init((pthread_cond_t *)local_68,(pthread_condattr_t *)0x0);
  pFVar3 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  pFVar3->cur_ = (char *)pFVar3;
  (this->currentBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = pFVar3;
  local_60 = &(this->currentBuffer_).
              super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FixedBuffer<4000000>*>
            (local_60,pFVar3);
  pFVar3 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  pFVar3->cur_ = (char *)pFVar3;
  (this->nextBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pFVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FixedBuffer<4000000>*>
            (&(this->nextBuffer_).
              super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             pFVar3);
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CountDownLatch::CountDownLatch(&this->latch_,1);
  if (1 < logFileName_->_M_string_length) {
    memset((this->currentBuffer_).
           super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0,4000000);
    memset((this->nextBuffer_).super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr,0,4000000);
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::reserve(&this->buffers_,0x10);
    return;
  }
  __assert_fail("logFileName_.size() > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Ventery[P]WebServer/WebServer/base/AsyncLogging.cpp"
                ,0x14,"AsyncLogging::AsyncLogging(std::string, int)");
}

Assistant:

AsyncLogging::AsyncLogging(std::string logFileName_, int flushInterval)
    : flushInterval_(flushInterval),
      running_(false),
      basename_(logFileName_),
      thread_(std::bind(&AsyncLogging::threadFunc, this), "Logging"),
      mutex_(),
      cond_(mutex_),
      currentBuffer_(new Buffer),
      nextBuffer_(new Buffer),
      buffers_(),
      latch_(1) {
  assert(logFileName_.size() > 1);
  currentBuffer_->bzero();
  nextBuffer_->bzero();
  buffers_.reserve(16);
}